

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnectionchannel.cpp
# Opt level: O0

void __thiscall QHttpNetworkConnectionChannel::abort(QHttpNetworkConnectionChannel *this)

{
  long lVar1;
  SocketState SVar2;
  long in_FS_OFFSET;
  anon_class_1_0_00000001 callAbort;
  QHttpNetworkConnectionChannel *pQVar3;
  undefined7 in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = this;
  if (*(long *)(this + 0x10) == 0) {
    *(undefined4 *)(this + 0x20) = 0;
  }
  else {
    SVar2 = QSocketAbstraction::socketState((QIODevice *)this);
    if (SVar2 == UnconnectedState) {
      *(undefined4 *)(this + 0x20) = 0;
    }
    else {
      *(undefined4 *)(this + 0x20) = 0x10;
    }
  }
  this[0x58] = (QHttpNetworkConnectionChannel)0x0;
  if (*(long *)(this + 0x10) != 0) {
    QSocketAbstraction::visit<QHttpNetworkConnectionChannel::abort()::__0&>
              ((anon_class_1_0_00000001 *)CONCAT17(0xaa,in_stack_fffffffffffffff0),
               (QIODevice *)pQVar3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QHttpNetworkConnectionChannel::abort()
{
    if (!socket)
        state = QHttpNetworkConnectionChannel::IdleState;
    else if (QSocketAbstraction::socketState(socket) == QAbstractSocket::UnconnectedState)
        state = QHttpNetworkConnectionChannel::IdleState;
    else
        state = QHttpNetworkConnectionChannel::ClosingState;

    // pendingEncrypt must only be true in between connected and encrypted states
    pendingEncrypt = false;

    if (socket) {
        // socket can be 0 since the host lookup is done from qhttpnetworkconnection.cpp while
        // there is no socket yet.
        auto callAbort = [](auto *s) {
            s->abort();
        };
        QSocketAbstraction::visit(callAbort, socket);
    }
}